

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O3

void __thiscall
asio::detail::reactive_socket_service_base::
start_accept_op<asio::detail::reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,asio::ip::tcp,std::function<void(std::error_code_const&)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
          *op,bool is_continuation,bool peer_is_open,void *param_5,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_accept_op<basic_socket<tcp>,_tcp,_function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_accept_op<basic_socket<tcp>,_tcp,_function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_6)

{
  atomic_count *paVar1;
  int __fd;
  reactor *prVar2;
  per_descriptor_data pdVar3;
  reactor_op *prVar4;
  bool bVar5;
  status sVar6;
  per_descriptor_data pdVar7;
  reactor_op *prVar8;
  undefined3 in_register_00000081;
  reactor *prVar9;
  uint32_t local_3c;
  per_descriptor_data local_38;
  
  prVar2 = this->reactor_;
  if (CONCAT31(in_register_00000081,peer_is_open) != 0) {
    std::error_code::operator=
              (&(op->
                super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                ).super_reactor_op.ec_,already_open);
LAB_003beca8:
    scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
    return;
  }
  prVar9 = prVar2;
  if ((impl->state_ & 3) == 0) {
    bVar5 = socket_ops::set_internal_non_blocking
                      (impl->socket_,&impl->state_,true,
                       &(op->
                        super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                        ).super_reactor_op.ec_);
    if (!bVar5) goto LAB_003beca8;
    prVar9 = this->reactor_;
  }
  pdVar3 = impl->reactor_data_;
  if (pdVar3 == (per_descriptor_data)0x0) {
    std::error_code::operator=
              (&(op->
                super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                ).super_reactor_op.ec_,bad_descriptor);
    goto LAB_003beca8;
  }
  __fd = impl->socket_;
  bVar5 = (pdVar3->mutex_).enabled_ == true;
  pdVar7 = pdVar3;
  if (bVar5) {
    pthread_mutex_lock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
    pdVar7 = impl->reactor_data_;
  }
  if (pdVar7->shutdown_ == false) {
    if (pdVar7->op_queue_[0].front_ == (reactor_op *)0x0) {
      if (pdVar7->op_queue_[2].front_ == (reactor_op *)0x0) {
        if (pdVar7->try_speculative_[0] == true) {
          sVar6 = (*(op->
                    super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                    ).super_reactor_op.perform_func_)((reactor_op *)op);
          if (sVar6 == done_and_exhausted) {
            if (impl->reactor_data_->registered_events_ != 0) {
              impl->reactor_data_->try_speculative_[0] = false;
            }
          }
          else if (sVar6 == not_done) {
            pdVar7 = impl->reactor_data_;
            goto LAB_003bed8c;
          }
          if (bVar5) {
            if ((pdVar3->mutex_).enabled_ == true) {
              pthread_mutex_unlock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
            }
            bVar5 = false;
          }
          scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
          goto LAB_003bed1d;
        }
LAB_003bed8c:
        if (pdVar7->registered_events_ == 0) goto LAB_003bed96;
      }
      else {
        if (pdVar7->registered_events_ == 0) {
LAB_003bed96:
          std::error_code::operator=
                    (&(op->
                      super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                      ).super_reactor_op.ec_,operation_not_supported);
          goto LAB_003becda;
        }
        local_3c = pdVar7->registered_events_;
        local_38 = pdVar7;
        epoll_ctl(prVar9->epoll_fd_,3,__fd,(epoll_event *)&local_3c);
        pdVar7 = impl->reactor_data_;
      }
    }
    (op->
    super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
    ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
    prVar4 = pdVar7->op_queue_[0].back_;
    prVar8 = (reactor_op *)pdVar7->op_queue_;
    if (prVar4 != (reactor_op *)0x0) {
      prVar8 = prVar4;
    }
    (prVar8->super_operation).next_ = (scheduler_operation *)op;
    pdVar7->op_queue_[0].back_ = (reactor_op *)op;
    LOCK();
    paVar1 = &prVar9->scheduler_->outstanding_work_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  else {
LAB_003becda:
    scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
  }
LAB_003bed1d:
  if (bVar5) {
    pthread_mutex_unlock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
  }
  return;
}

Assistant:

void start_accept_op(base_implementation_type& impl, Op* op,
      bool is_continuation, bool peer_is_open, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_accept_op(impl, op, is_continuation, peer_is_open,
        &reactor::call_post_immediate_completion, &reactor_);
  }